

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginLV2export.cpp
# Opt level: O2

void addAttribute(String *text,char *attribute,char **values,uint indent,bool endInDot)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  uint j;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  pcVar4 = *values;
  if (pcVar4 != (char *)0x0) {
    sVar1 = strlen(attribute);
    uVar3 = 0;
    while (pcVar4 != (char *)0x0) {
      iVar5 = 4;
      while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
        DISTRHO::String::operator+=(text," ");
      }
      if (uVar3 == 0) {
        DISTRHO::String::operator+=(text,attribute);
      }
      else {
        for (uVar6 = 0; uVar6 < sVar1; uVar6 = (ulong)((int)uVar6 + 1)) {
          DISTRHO::String::operator+=(text," ");
        }
      }
      DISTRHO::String::operator+=(text," ");
      pcVar4 = values[uVar3];
      pcVar2 = strstr(pcVar4,"://");
      if ((pcVar2 != (char *)0x0) || (iVar5 = strncmp(pcVar4,"urn:",4), iVar5 == 0)) {
        DISTRHO::String::operator+=(text,"<");
        DISTRHO::String::operator+=(text,values[uVar3]);
        pcVar4 = ">";
      }
      DISTRHO::String::operator+=(text,pcVar4);
      uVar3 = (ulong)((int)uVar3 + 1);
      pcVar4 = " ,\n";
      if (values[uVar3] == (char *)0x0) {
        pcVar4 = " ;\n\n";
      }
      DISTRHO::String::operator+=(text,pcVar4);
      pcVar4 = values[uVar3];
    }
  }
  return;
}

Assistant:

static void addAttribute(DISTRHO_NAMESPACE::String& text,
                         const char* const attribute,
                         const char* const values[],
                         const uint indent,
                         const bool endInDot = false)
{
    if (values[0] == nullptr)
    {
        if (endInDot)
        {
            bool found;
            const size_t index = text.rfind(';', &found);
            if (found) text[index] = '.';
        }
        return;
    }

    const size_t attributeLength = std::strlen(attribute);

    for (uint i = 0; values[i] != nullptr; ++i)
    {
        for (uint j = 0; j < indent; ++j)
            text += " ";

        if (i == 0)
        {
            text += attribute;
        }
        else
        {
            for (uint j = 0; j < attributeLength; ++j)
                text += " ";
        }

        text += " ";

        const bool isUrl = std::strstr(values[i], "://") != nullptr || std::strncmp(values[i], "urn:", 4) == 0;
        if (isUrl) text += "<";
        text += values[i];
        if (isUrl) text += ">";
        text += values[i + 1] ? " ,\n" : (endInDot ? " .\n\n" : " ;\n\n");
    }
}